

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O3

ByteArray<6UL> __thiscall supermap::ByteArray<6UL>::fromString(ByteArray<6UL> *this,string *str)

{
  pointer pcVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  IllegalArgumentException *this_00;
  size_t i;
  long lVar3;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (str->_M_string_length == 6) {
    _Var2._M_head_impl = (uchar *)operator_new__(6);
    _Var2._M_head_impl[0] = '\0';
    _Var2._M_head_impl[1] = '\0';
    _Var2._M_head_impl[2] = '\0';
    _Var2._M_head_impl[3] = '\0';
    _Var2._M_head_impl[4] = '\0';
    _Var2._M_head_impl[5] = '\0';
    (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = _Var2._M_head_impl;
    pcVar1 = (str->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      _Var2._M_head_impl[lVar3] = pcVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    return (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)
           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>)this;
  }
  this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_58,6);
  std::operator+(&local_38,
                 "String length can not be different to template size parameter, expected ",
                 &sStack_58);
  supermap::IllegalArgumentException::IllegalArgumentException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&IllegalArgumentException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static ByteArray<Len> fromString(const std::string &str) {
        if (str.length() != Len) {
            throw IllegalArgumentException(
                "String length can not be different to template size parameter, expected " + std::to_string(Len));
        }
        ByteArray<Len> arr;
        for (std::size_t i = 0; i < str.length(); ++i) {
            arr.getCharsPointer()[i] = str[i];
        }
        return arr;
    }